

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
               (uhugeint_t *ldata,uhugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  long lVar12;
  ulong uVar13;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar12 = 0;
      do {
        puVar1 = (undefined8 *)((long)&ldata->lower + lVar12);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&result_data->lower + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar12 = lVar12 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var6 = p_Stack_40;
      peVar5 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar5;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var6;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar7->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar3;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar10 = 0;
      uVar8 = 0;
      do {
        if (puVar3 == (unsigned_long *)0x0) {
          uVar11 = 0xffffffffffffffff;
        }
        else {
          uVar11 = puVar3[uVar10];
        }
        uVar13 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar13 = count;
        }
        uVar9 = uVar13;
        if (uVar11 != 0) {
          uVar9 = uVar8;
          if (uVar11 == 0xffffffffffffffff) {
            if (uVar8 < uVar13) {
              lVar12 = uVar8 << 4;
              do {
                puVar1 = (undefined8 *)((long)&ldata->lower + lVar12);
                uVar4 = puVar1[1];
                puVar2 = (undefined8 *)((long)&result_data->lower + lVar12);
                *puVar2 = *puVar1;
                puVar2[1] = uVar4;
                uVar9 = uVar9 + 1;
                lVar12 = lVar12 + 0x10;
              } while (uVar13 != uVar9);
            }
          }
          else if (uVar8 < uVar13) {
            lVar12 = uVar8 << 4;
            uVar9 = 0;
            do {
              if ((uVar11 >> (uVar9 & 0x3f) & 1) != 0) {
                puVar1 = (undefined8 *)((long)&ldata->lower + lVar12);
                uVar4 = puVar1[1];
                puVar2 = (undefined8 *)((long)&result_data->lower + lVar12);
                *puVar2 = *puVar1;
                puVar2[1] = uVar4;
              }
              uVar9 = uVar9 + 1;
              lVar12 = lVar12 + 0x10;
            } while ((uVar8 - uVar13) + uVar9 != 0);
            uVar9 = uVar8 + uVar9;
          }
        }
        uVar10 = uVar10 + 1;
        uVar8 = uVar9;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}